

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_6::InSliceInfo::InSliceInfo
          (InSliceInfo *this,PixelType tifb,char *b,PixelType tifl,size_t xpst,size_t ypst,
          size_t spst,int xsm,int ysm,bool f,bool s,double fv)

{
  double fv_local;
  bool s_local;
  bool f_local;
  size_t ypst_local;
  size_t xpst_local;
  PixelType tifl_local;
  char *b_local;
  PixelType tifb_local;
  InSliceInfo_conflict *this_local;
  
  this->typeInFrameBuffer = tifb;
  this->typeInFile = tifl;
  this->base = b;
  this->yStride = xpst;
  this->xSampling = (int)ypst;
  this->ySampling = (int)(ypst >> 0x20);
  this->fill = (bool)(undefined1)spst;
  this->skip = (bool)spst._1_1_;
  *(undefined6 *)&this->field_0x2a = spst._2_6_;
  *(int *)&this->fillValue = xsm;
  *(int *)((long)&this->fillValue + 4) = ysm;
  *(bool *)&this[1].typeInFrameBuffer = f;
  *(bool *)((long)&this[1].typeInFrameBuffer + 1) = s;
  this[1].base = (char *)fv;
  return;
}

Assistant:

InSliceInfo::InSliceInfo (PixelType tifb,
                          char * b,
                          PixelType tifl,
                          size_t xpst,
                          size_t ypst,
                          size_t spst,
                          int xsm, int ysm,
                          bool f, bool s,
                          double fv)
:
    typeInFrameBuffer (tifb),
    typeInFile (tifl),
    base(b),
    xPointerStride (xpst),
    yPointerStride (ypst),
    sampleStride (spst),
    xSampling (xsm),
    ySampling (ysm),
    fill (f),
    skip (s),
    fillValue (fv)
{
    // empty
}